

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

GLuint __thiscall vera::Shader::compileShader(Shader *this,string *_src,GLenum _type,bool _verbose)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pcVar5;
  string *_string;
  char cVar6;
  bool bVar7;
  int iVar8;
  istream *piVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  size_t sVar12;
  ostream *poVar13;
  undefined7 in_register_00000009;
  size_type *psVar14;
  _Self __tmp;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  string srcVersion;
  GLint infoLength;
  GLint isCompiled;
  string dataRead;
  size_t glslVersionNumber;
  string prolog;
  string srcBody;
  GLchar *sources [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chuncks;
  istringstream versionIss;
  istringstream srcIss;
  ostringstream srcOss;
  GLuint local_5dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  int local_5b4;
  int local_5b0;
  GLenum local_5ac;
  string local_5a8;
  vector<char,_std::allocator<char>_> local_588;
  undefined1 *local_570 [2];
  undefined1 local_560 [16];
  ulong local_550;
  Shader *local_548;
  string *local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528 [16];
  undefined1 *local_518;
  undefined1 *local_510;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  string local_4e8;
  string local_4c8;
  string local_4a8 [3];
  ios_base local_430 [264];
  string local_328 [3];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_570,"","",CONCAT71(in_register_00000009,_verbose));
  local_538 = local_528;
  local_530 = 0;
  local_528[0] = 0;
  std::__cxx11::string::substr((ulong)local_328,(ulong)_src);
  iVar8 = std::__cxx11::string::compare((char *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
    operator_delete(local_328[0]._M_dataplus._M_p);
  }
  local_540 = _src;
  if (iVar8 == 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)local_328,(string *)_src,_S_in);
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    local_5d8._M_string_length = 0;
    local_5d8.field_2._M_local_buf[0] = '\0';
    cVar6 = std::ios::widen((char)local_328 +
                            (char)*(undefined8 *)(local_328[0]._M_dataplus._M_p + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_328,(string *)&local_5d8,cVar6);
    paVar3 = &local_4a8[0].field_2;
    local_4a8[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4a8,local_5d8._M_dataplus._M_p,
               local_5d8._M_dataplus._M_p + local_5d8._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)local_4a8,local_4a8[0]._M_string_length,0,'\x01');
    std::__cxx11::string::_M_append((char *)local_570,(ulong)local_4a8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_4a8[0]._M_dataplus._M_p);
    }
    local_4a8[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"");
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)local_1a8,(string *)local_4a8,_S_out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
      operator_delete(local_4a8[0]._M_dataplus._M_p);
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_328[0]._M_dataplus._M_p + -0x18) +
                              (char)local_328);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_328,(string *)&local_5a8,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_5a8._M_dataplus._M_p,
                           local_5a8._M_string_length);
      local_4a8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_4a8,1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_538,(string *)local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
      operator_delete(local_4a8[0]._M_dataplus._M_p);
    }
    local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_4a8,(string *)&local_5d8,_S_in);
    std::operator>>((istream *)local_4a8,(string *)&local_5a8);
    std::istream::_M_extract<unsigned_long>((ulong *)local_4a8);
    pcVar16 = local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + -0x97;
    std::__cxx11::istringstream::~istringstream((istringstream *)local_4a8);
    std::ios_base::~ios_base(local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p);
    }
    uVar17 = (ulong)(pcVar16 < (char *)0xffffffffffffffd7);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_328);
    std::ios_base::~ios_base(local_2b0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_538);
    uVar17 = 0;
  }
  if ((this->super_HaveDefines).m_defineChange == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_defineStack,0,(char *)(this->m_defineStack)._M_string_length,0x3194fe
              );
    p_Var11 = (this->super_HaveDefines).m_defines._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var1 = &(this->super_HaveDefines).m_defines._M_t._M_impl.super__Rb_tree_header;
    local_5ac = _type;
    local_550 = uVar17;
    local_548 = this;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      do {
        std::operator+(&local_5d8,"#define ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_5d8);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_1a8[0].field_2._0_8_ = *psVar14;
          local_1a8[0].field_2._8_8_ = plVar10[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar14;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_1a8[0]._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)(p_Var11 + 2))
        ;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4a8[0].field_2._0_8_ = *psVar14;
          local_4a8[0].field_2._8_8_ = plVar10[3];
          local_4a8[0]._M_dataplus._M_p = (pointer)&local_4a8[0].field_2;
        }
        else {
          local_4a8[0].field_2._0_8_ = *psVar14;
          local_4a8[0]._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_4a8[0]._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)local_4a8,local_4a8[0]._M_string_length,0,'\x01');
        local_328[0]._M_dataplus._M_p = (pointer)&local_328[0].field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_328[0].field_2._0_8_ = *psVar14;
          local_328[0].field_2._8_8_ = plVar10[3];
        }
        else {
          local_328[0].field_2._0_8_ = *psVar14;
          local_328[0]._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_328[0]._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&this->m_defineStack,(ulong)local_328[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
          operator_delete(local_328[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
          operator_delete(local_4a8[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    (local_548->super_HaveDefines).m_defineChange = false;
    uVar17 = local_550;
    this = local_548;
    _type = local_5ac;
  }
  std::__cxx11::string::_M_append((char *)local_570,(ulong)(this->m_defineStack)._M_dataplus._M_p);
  paVar3 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)local_1a8,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_1a8[0]._M_dataplus._M_p,(uint)local_1a8[0]._M_string_length,uVar17 + (iVar8 == 0)
            );
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x2f3f47);
  local_4a8[0]._M_dataplus._M_p = (pointer)&local_4a8[0].field_2;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_4a8[0].field_2._0_8_ = *psVar14;
    local_4a8[0].field_2._8_8_ = plVar10[3];
  }
  else {
    local_4a8[0].field_2._0_8_ = *psVar14;
    local_4a8[0]._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_4a8[0]._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)local_4a8);
  local_328[0]._M_dataplus._M_p = (pointer)&local_328[0].field_2;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_328[0].field_2._0_8_ = *psVar14;
    local_328[0].field_2._8_8_ = plVar10[3];
  }
  else {
    local_328[0].field_2._0_8_ = *psVar14;
    local_328[0]._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_328[0]._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_570,(ulong)local_328[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
    operator_delete(local_328[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
    operator_delete(local_4a8[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  local_518 = local_570[0];
  local_510 = local_538;
  local_5dc = glCreateShader(_type);
  glShaderSource(local_5dc,2,&local_518,0);
  glCompileShader(local_5dc);
  glGetShaderiv(local_5dc,0x8b81,&local_5b0);
  local_5b4 = 0;
  glGetShaderiv(local_5dc,0x8b84);
  if (1 < (long)local_5b4) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_588,(long)local_5b4,(allocator_type *)local_328);
    glGetShaderInfoLog(local_5dc,local_5b4,0,
                       local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Found ",6);
    pcVar16 = "warning ";
    if (local_5b0 == 0) {
      pcVar16 = "error";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar16,(ulong)(local_5b0 != 0) * 3 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," while compiling ",0x11);
    pcVar16 = "vertex";
    if (_type == 0x8b30) {
      pcVar16 = "fragment";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar16,(ulong)(_type == 0x8b30) * 2 + 6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," shader",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    pcVar5 = local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_328[0]._M_dataplus._M_p = (pointer)&local_328[0].field_2;
    if (local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (char *)0x0) {
      pcVar16 = (char *)0x1;
    }
    else {
      sVar12 = strlen(local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pcVar16 = pcVar5 + sVar12;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,pcVar5,pcVar16);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_328[0]._M_dataplus._M_p,
                         local_328[0]._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    split(&local_500,local_328,' ',false);
    pcVar4 = ((local_500.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c8,pcVar4,
               pcVar4 + (local_500.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"(","");
    paVar2 = &local_5d8.field_2;
    local_5d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,":","");
    replaceAll(local_4a8,&local_4c8,local_1a8,&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e8,local_4a8[0]._M_dataplus._M_p,
               local_4a8[0]._M_dataplus._M_p + local_4a8[0]._M_string_length);
    local_5d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,")","");
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,":","");
    replaceAll(local_1a8,&local_4e8,&local_5d8,&local_5a8);
    std::__cxx11::string::operator=((string *)local_4a8,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p);
    }
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a8,local_4a8,':',false);
    _string = local_540;
    bVar7 = isInt((string *)(local_1a8[0]._M_dataplus._M_p + 0x20));
    if (bVar7) {
      iVar8 = toInt((string *)(local_1a8[0]._M_dataplus._M_p + 0x20));
      uVar17 = (ulong)iVar8;
    }
    else {
      uVar17 = 0;
    }
    if (1 < uVar17) {
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_5d8,_string,'\n',true);
      lVar15 = uVar17 * 0x20 + -0x38;
      for (lVar18 = uVar17 - 1;
          (lVar18 - 1U <
           (ulong)((long)(local_5d8._M_string_length - (long)local_5d8._M_dataplus._M_p) >> 5) &&
          (lVar18 - 1U < uVar17 + 1)); lVar18 = lVar18 + 1) {
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,*(char **)(local_5d8._M_dataplus._M_p + lVar15 + -8),
                             *(long *)(local_5d8._M_dataplus._M_p + lVar15));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        lVar15 = lVar15 + 0x20;
        std::ostream::flush();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5d8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
      operator_delete(local_4a8[0]._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
      operator_delete(local_328[0]._M_dataplus._M_p);
    }
    if (local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_5b0 == 0) {
    glDeleteShader(local_5dc);
    local_5dc = 0;
  }
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  if (local_570[0] != local_560) {
    operator_delete(local_570[0]);
  }
  return local_5dc;
}

Assistant:

GLuint Shader::compileShader(const std::string& _src, GLenum _type, bool _verbose) {
    std::string prolog = "";

    //
    // detect #version directive at the beginning of the shader, move it to the prolog and remove it from the shader
    //

    std::string srcBody; // _src stripped of any #version directive at the beginning
    bool zeroBasedLineDirective; // true for GLSL core 1.10 to 1.50
    bool srcVersionFound = _src.substr(0, 8) == "#version"; // true if user provided a #version directive at the beginning of _src

    if (srcVersionFound) {
        //
        // split _src into srcVersion and srcBody
        //

        std::istringstream srcIss(_src);

        // the version line can be read without checking the result of getline(), srcVersionFound == true implies this
        std::string srcVersion;
        std::getline(srcIss,srcVersion);

        // move the #version directive to the top of the prolog
        prolog += srcVersion + '\n';

        // copy the rest of the shader into srcBody
        std::ostringstream srcOss("");
        std::string dataRead;
        while (std::getline(srcIss,dataRead)) {
            srcOss << dataRead << '\n';
        }
        srcBody = srcOss.str();

        //
        // try to determine which version are we actually using
        //

        size_t glslVersionNumber = 0;
        std::istringstream versionIss(srcVersion);
        versionIss >> dataRead; // consume the "#version" string which is guaranteed to be there
        versionIss >> glslVersionNumber; // try to read the next token and convert it to a number

        //
        // determine if the glsl version number starts numbering the #line directive from 0 or from 1
        //
        // #version 100        : "es"   profile, numbering starts from 1
        // #version 110 to 150 : "core" profile, numbering starts from 0
        // #version 200        : "es"   profile, numbering starts from 1
        // #version 300 to 320 : "es"   profile, numbering starts from 1
        // #version 330+       : all           , numbering starts from 1
        //
        // Any malformed or invalid #version directives are of no interest here, the shader compiler
        // will take care of reporting this to the user later.
        //

        zeroBasedLineDirective = (glslVersionNumber >= 110 && glslVersionNumber <= 150);

    } else {
        // no #version directive found at the beginning of _src, which means...
        srcBody = _src; // ... _src contains the whole shader body and ...
        zeroBasedLineDirective = true; // ... glsl defaults to version 1.10, which starts numbering #line directives from 0.
    }

    // Only update the define stack string when it change
    if (m_defineChange) {
        m_defineStack = "";
        for (DefinesMap_it it = m_defines.begin(); it != m_defines.end(); it++)
            m_defineStack += "#define " + it->first + " " + it->second + '\n';
        m_defineChange = false;
    }
    prolog += m_defineStack;

    //
    // determine the #line offset to be used for conciliating lines in glsl error messages and the line number in the editor
    //
    // #line 0 : no version specified by user, glsl defaults to version 1.10, shader source used without modifications
    // #line 1 : user specified #version 1.10 to 1.50, which start numbering #line from 0, version line removed from _src
    // #line 2 : user specified a version #version other than 1.10 to 1.50, those start numbering #line from 1, version line removed from _src
    //

    size_t startLine = (srcVersionFound ? 1 : 0) + (zeroBasedLineDirective ? 0 : 1);
    prolog += "#line " + std::to_string(startLine) + "\n";

    // if (_verbose) {
    //     if (_type == GL_VERTEX_SHADER) {
    //         std::cout << "// ---------- Vertex Shader" << std::endl;
    //     }
    //     else {
    //         std::cout << "// ---------- Fragment Shader" << std::endl;
    //     }
    //     std::cout << prolog << std::endl;
    //     std::cout << srcBody << std::endl;
    // }

    const GLchar* sources[2] = {
        (const GLchar*) prolog.c_str(),
        (const GLchar*) srcBody.c_str()
    };

    GLuint shader = glCreateShader(_type);
    glShaderSource(shader, 2, sources, NULL);
    glCompileShader(shader);

    GLint isCompiled;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &isCompiled);

    GLint infoLength = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLength);

#if defined(PLATFORM_RPI) || defined(__EMSCRIPTEN__)
    if (infoLength > 1 && !isCompiled) {
#else
    if (infoLength > 1) {
#endif
        std::vector<GLchar> infoLog(infoLength);
        glGetShaderInfoLog(shader, infoLength, NULL, &infoLog[0]);
        std::cerr << "Found " << (isCompiled ? "warning " : "error") << " while compiling " << ((_type == GL_FRAGMENT_SHADER)? "fragment" : "vertex") << " shader" << std::endl;
        std::string error_msg = &infoLog[0];
        std::cerr << error_msg << std::endl;

        std::vector<std::string> chuncks = vera::split(error_msg, ' ');
        size_t line_number = 0;

#if defined(__APPLE__)
    // Error Message on Apple M1
        // ERROR: 0:41: 'color' : syntax error: syntax error

        std::vector<std::string> error_loc = vera::split(chuncks[1], ':');
        if (vera::isInt(error_loc[1]))
            line_number = vera::toInt(error_loc[1]);

#elif defined(_WIN32)

#elif defined(__EMSCRIPTEN__)

#else
    // Linux ARM
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

    // Linux iX86
        // Error Message on Mesa Intel(R) Iris(R) Plus Graohics (ICL GT2)
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

        // Error Message on NVdia GeForce GTX 1650
        // 0(41) : error C0000: syntax error, unexpected '.', expecting "::" at token "."

        std::string error_loc1 = vera::replaceAll(chuncks[0], "(", ":");
        error_loc1 = vera::replaceAll(error_loc1, ")", ":");
        std::vector<std::string> error_loc2 = vera::split(error_loc1, ':');
        if (vera::isInt(error_loc2[1]))
            line_number = vera::toInt(error_loc2[1]);

#endif

        // Print line (-/+ lines for context)
        if (line_number > 1) {
            line_number -= 2;
            std::vector<std::string> lines = vera::split(_src, '\n', true);
            for (size_t i = line_number; i < lines.size() && i < line_number + 3; i++)
                std::cerr << i + 1 << " " << lines[i] << std::endl;
        }

    }

    if (isCompiled == GL_FALSE) {
        glDeleteShader(shader);
        return 0;
    }

    return shader;
}

void Shader::detach(GLenum _type) {
#ifndef __EMSCRIPTEN__
    bool vert = (GL_VERTEX_SHADER & _type) == GL_VERTEX_SHADER;
    bool frag = (GL_FRAGMENT_SHADER & _type) == GL_FRAGMENT_SHADER;

    if (vert) {
        glDeleteShader(m_vertexShader);
        glDetachShader(m_vertexShader, GL_VERTEX_SHADER);
    }

    if (frag) {
        glDeleteShader(m_fragmentShader);
        glDetachShader(m_fragmentShader, GL_FRAGMENT_SHADER);
    }
#endif
}

GLint Shader::getUniformLocation(const std::string& _uniformName) const {
    GLint loc = glGetUniformLocation(m_program, _uniformName.c_str());
    if (loc == -1){
        // std::cerr << "Uniform " << _uniformName << " not found" << std::endl;
    }
    return loc;
}

void Shader::setUniform(const std::string& _name, int _x) {
    if (inUse()) {
        glUniform1i(getUniformLocation(_name), _x);
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y) {
    if (inUse()) {
        glUniform2i(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2i(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z) {
    if (inUse()) {
        glUniform3i(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3i(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z, int _w) {
    if (inUse()) {
        glUniform4i(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec4i(" << _x << "," << _y << "," << _z << << "," << _w << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const int *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1i(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2i(loc, _array[0], _array[1]);
            std::cout << _name << ',' << _array[0] << ',' << _array[1] << std::endl;
        }
        else if (_size == 3) {
            glUniform3i(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4i(loc, _array[0], _array[1], _array[2], _array[3]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, float _x) {
    if (inUse()) {
        glUniform1f(getUniformLocation(_name), _x);
        // std::cout << "Uniform " << _name << ": float(" << _x << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y) {
    if (inUse()) {
        glUniform2f(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z) {
    if (inUse()) {
        glUniform3f(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z, float _w) {
    if (inUse()) {
        glUniform4f(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const float *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1f(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2f(loc, _array[0], _array[1]);
        }
        else if (_size == 3) {
            glUniform3f(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4f(loc, _array[0], _array[1], _array[2], _array[2]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec2 *_array, size_t _size) {
    if (inUse()) {
        glUniform2fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec3 *_array, size_t _size) {
    if (inUse()) {
        glUniform3fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec4 *_array, size_t _size) {
    if (inUse()) {
        glUniform4fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniformTexture(const std::string& _name, GLuint _textureId, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_2D, _textureId);
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex, size_t _texLoc) {
    setUniformTexture(_name, _tex->getTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getTextureId(), _texLoc);
}

void Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex) {
    setUniformTexture(_name, _tex->getTextureId(), textureIndex++);
}

void  Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getTextureId(), textureIndex++);
}

void  Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), textureIndex++);
}

void Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_CUBE_MAP, _tex->getTextureId());
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void  Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex) {
    setUniformTextureCube(_name, _tex, textureIndex++);
}

void Shader::setUniform(const std::string& _name, const glm::mat2& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix2fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat3& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix3fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat4& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix4fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

}